

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O2

int isWellFormed(ltlNode *topNode)

{
  ltlNode_t *plVar1;
  int iVar2;
  long lVar3;
  
  do {
    switch(topNode->type) {
    case AND:
    case OR:
    case IMPLY:
      iVar2 = isWellFormed(topNode->left);
      lVar3 = 0x20;
      if (iVar2 == 0) {
        return 0;
      }
      break;
    case NOT:
      lVar3 = 0x18;
      if (topNode->right != (ltlNode_t *)0x0) {
        __assert_fail("topNode->right == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x29f,"int isWellFormed(ltlNode *)");
      }
      break;
    case GLOBALLY:
      if (topNode->right != (ltlNode_t *)0x0) {
        __assert_fail("topNode->right == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x2a5,"int isWellFormed(ltlNode *)");
      }
      plVar1 = topNode->left;
      if (plVar1->type == EVENTUALLY) {
        if (plVar1->right != (ltlNode_t *)0x0) {
          __assert_fail("nextNode->right == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                        ,0x2aa,"int isWellFormed(ltlNode *)");
        }
        iVar2 = isNonTemporalSubformula(plVar1->left);
        return iVar2;
      }
    default:
      return 0;
    case BOOL:
      return 1;
    }
    topNode = *(ltlNode **)((long)&topNode->type + lVar3);
  } while( true );
}

Assistant:

int isWellFormed( ltlNode *topNode )
{
	ltlNode *nextNode;

	switch( topNode->type ){
		case AND:
		case OR:
		case IMPLY:
			return isWellFormed( topNode->left) && isWellFormed( topNode->right ) ;
		case NOT:
			assert( topNode->right == NULL );
			return isWellFormed( topNode->left );
		case BOOL:
			return 1;
		case GLOBALLY:
			nextNode = topNode->left;
			assert( topNode->right == NULL );
			if( nextNode->type != EVENTUALLY )
				return 0;
			else
			{
				assert( nextNode->right == NULL );
				return isNonTemporalSubformula( nextNode->left );
			}
		default:
			return 0;
	}
}